

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

int SoapySDRDevice_setDCOffset
              (SoapySDRDevice *device,int direction,size_t channel,double offsetI,double offsetQ)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  exception *ex;
  complex<double> local_40;
  double local_30;
  double local_28;
  undefined8 local_20;
  undefined4 local_14;
  long *local_10;
  
  local_30 = in_XMM1_Qa;
  local_28 = in_XMM0_Qa;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::complex<double>::complex(&local_40,local_28,local_30);
  (**(code **)(*local_10 + 0x110))(local_10,local_14,local_20,&local_40);
  return 0;
}

Assistant:

int SoapySDRDevice_setDCOffset(SoapySDRDevice *device, const int direction, const size_t channel, const double offsetI, const double offsetQ)
{
    __SOAPY_SDR_C_TRY
    device->setDCOffset(direction, channel, std::complex<double>(offsetI, offsetQ));
    __SOAPY_SDR_C_CATCH
}